

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parsePrecUnary(Parser *this)

{
  Token *pTVar1;
  bool bVar2;
  pointer *__ptr;
  Parser *in_RSI;
  undefined1 local_c8 [16];
  optional<enact::Token> region;
  Token oper;
  Token oper_1;
  
  bVar2 = consume(in_RSI,MINUS);
  if ((((bVar2) || (bVar2 = consume(in_RSI,TILDE), bVar2)) || (bVar2 = consume(in_RSI,STAR), bVar2))
     || (bVar2 = consume(in_RSI,NOT), bVar2)) {
    Token::Token(&oper,&in_RSI->m_previous);
    parsePrecUnary((Parser *)&region);
    std::
    make_unique<enact::UnaryExpr,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,enact::Token>
              ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)&oper_1,
               (Token *)&region);
    this->m_context = (CompileContext *)oper_1._0_8_;
    if (region.super__Optional_base<enact::Token,_false,_false>._M_payload.
        super__Optional_payload<enact::Token,_true,_false,_false>.
        super__Optional_payload_base<enact::Token>._M_payload._0_8_ != 0) {
      (**(code **)(*(long *)region.super__Optional_base<enact::Token,_false,_false>._M_payload.
                            super__Optional_payload<enact::Token,_true,_false,_false>.
                            super__Optional_payload_base<enact::Token>._M_payload._0_8_ + 8))();
    }
    pTVar1 = &oper;
  }
  else {
    bVar2 = consume(in_RSI,AMPERSAND);
    if (!bVar2) {
      parsePrecCall(this);
      return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
             (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
    }
    pTVar1 = &in_RSI->m_previous;
    Token::Token(&oper_1,pTVar1);
    bVar2 = consume(in_RSI,MUT);
    if ((bVar2) || (bVar2 = consume(in_RSI,IMM), bVar2)) {
      std::optional<enact::Token>::operator=((optional<enact::Token> *)&oper,pTVar1);
    }
    region.super__Optional_base<enact::Token,_false,_false>._M_payload.
    super__Optional_payload<enact::Token,_true,_false,_false>.
    super__Optional_payload_base<enact::Token>._M_engaged = false;
    bVar2 = consume(in_RSI,SO);
    if (((bVar2) || (bVar2 = consume(in_RSI,RC), bVar2)) || (bVar2 = consume(in_RSI,GC), bVar2)) {
      std::optional<enact::Token>::operator=(&region,pTVar1);
    }
    parsePrecUnary((Parser *)local_c8);
    std::
    make_unique<enact::ReferenceExpr,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,enact::Token,std::optional<enact::Token>,std::optional<enact::Token>>
              ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)(local_c8 + 8),
               (Token *)local_c8,(optional<enact::Token> *)&oper_1,(optional<enact::Token> *)&oper);
    this->m_context = (CompileContext *)local_c8._8_8_;
    if ((CompileContext *)local_c8._0_8_ != (CompileContext *)0x0) {
      (**(code **)((((string *)local_c8._0_8_)->_M_dataplus)._M_p + 8))();
    }
    std::_Optional_payload_base<enact::Token>::_M_reset
              ((_Optional_payload_base<enact::Token> *)&region);
    std::_Optional_payload_base<enact::Token>::_M_reset
              ((_Optional_payload_base<enact::Token> *)&oper);
    pTVar1 = &oper_1;
  }
  std::__cxx11::string::~string((string *)&pTVar1->lexeme);
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parsePrecUnary() {
        if (consume(TokenType::MINUS) ||
            consume(TokenType::TILDE) ||
            consume(TokenType::STAR) ||
            consume(TokenType::NOT)) {
            Token oper = m_previous;
            std::unique_ptr<Expr> expr = parsePrecUnary(); // Right recursion
            return std::make_unique<UnaryExpr>(std::move(expr), std::move(oper));
        }

        if (consume(TokenType::AMPERSAND)) {
            Token oper = m_previous;

            std::optional<Token> permission;
            if (consume(TokenType::MUT) || consume(TokenType::IMM)) {
                permission = m_previous;
            }

            std::optional<Token> region;
            if (consume(TokenType::SO) || consume(TokenType::RC) || consume(TokenType::GC)) {
                region = m_previous;
            }

            std::unique_ptr<Expr> expr = parsePrecUnary(); // Right recursion

            return std::make_unique<ReferenceExpr>(
                    std::move(expr),
                    std::move(oper),
                    std::move(permission),
                    std::move(region));
        }

        return parsePrecCall();
    }